

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

string * __thiscall
ccs::ParserImpl::parseIdent_abi_cxx11_(string *__return_storage_ptr__,ParserImpl *this,char *what)

{
  bool bVar1;
  ostream *poVar2;
  parse_error *ppVar3;
  string local_370;
  ostringstream local_350 [8];
  ostringstream _message_1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream _message;
  char *what_local;
  ParserImpl *this_local;
  
  bVar1 = advanceIf(this,IDENT);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(this->last_).value);
  }
  else {
    bVar1 = advanceIf(this,STRING);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_350);
      poVar2 = anon_unknown_0::operator<<((ostream *)local_350,(this->cur_).type);
      poVar2 = std::operator<<(poVar2," cannot occur here. Expected ");
      std::operator<<(poVar2,what);
      ppVar3 = (parse_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      anon_unknown_0::parse_error::parse_error(ppVar3,&local_370,(this->cur_).location);
      __cxa_throw(ppVar3,&(anonymous_namespace)::parse_error::typeinfo,
                  anon_unknown_0::parse_error::~parse_error);
    }
    bVar1 = StringVal::interpolation(&(this->last_).stringValue);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar2 = std::operator<<((ostream *)local_198,"Interpolation not allowed in ");
      std::operator<<(poVar2,what);
      ppVar3 = (parse_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      anon_unknown_0::parse_error::parse_error(ppVar3,&local_1c8,(this->last_).location);
      __cxa_throw(ppVar3,&(anonymous_namespace)::parse_error::typeinfo,
                  anon_unknown_0::parse_error::~parse_error);
    }
    StringVal::str_abi_cxx11_(__return_storage_ptr__,&(this->last_).stringValue);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parseIdent(const char *what) {
    if (advanceIf(Token::IDENT)) return last_.value;
    if (advanceIf(Token::STRING)) {
      if (last_.stringValue.interpolation())
        THROW(last_.location, "Interpolation not allowed in " << what);
      return last_.stringValue.str();
    }
    THROW(cur_.location, cur_.type << " cannot occur here. Expected " << what);
  }